

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Raytracer.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Raytracer *raytracer)

{
  ostream *poVar1;
  Raytracer *raytracer_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Raytracer {");
  poVar1 = std::operator<<(poVar1,"imgWidth: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,raytracer->imgWidth);
  poVar1 = std::operator<<(poVar1," imgHeight: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,raytracer->imgHeight);
  poVar1 = std::operator<<(poVar1," camera: ");
  poVar1 = operator<<(poVar1,&raytracer->camera);
  poVar1 = std::operator<<(poVar1," backgroundColor: ");
  poVar1 = operator<<(poVar1,&raytracer->backgroundColor);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Raytracer &raytracer) {
    os << "Raytracer {"<<"imgWidth: " << raytracer.imgWidth << " imgHeight: " << raytracer.imgHeight
       << " camera: " << raytracer.camera << " backgroundColor: " << raytracer.backgroundColor<<std::endl<<"}"<<std::endl;
    return os;
}